

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O1

uint32_t * parsed_skip(uint32_t *pptr,uint32_t skiptype)

{
  bool bVar1;
  uint32_t *in_RAX;
  uint32_t *puVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = 0;
  do {
    uVar4 = *pptr;
    bVar1 = true;
    puVar2 = pptr;
    switch(uVar4 >> 0x10 ^ 0x8000) {
    case 0:
      goto switchD_001461c5_caseD_0;
    case 1:
      if (iVar3 != 0 || skiptype != 0) break;
LAB_0014625b:
      iVar3 = 0;
      goto LAB_001461f1;
    case 2:
    case 8:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x1a:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
      iVar3 = iVar3 + 1;
      break;
    case 3:
      pptr = pptr + (ulong)(9 < (uVar4 & 0xfffe)) * 2;
      break;
    default:
      if (-1 < (int)uVar4) {
        bVar1 = false;
        puVar2 = in_RAX;
        goto LAB_001461f1;
      }
      break;
    case 0xd:
      if (skiptype == 1) goto LAB_001461f1;
      break;
    case 0x18:
      if ((uVar4 & 0xffff) - 0x1b < 2) {
        pptr = pptr + 3;
      }
      else if ((uVar4 & 0xffff) - 0xf < 2) {
        pptr = pptr + 1;
      }
      break;
    case 0x19:
      if (iVar3 == 0) goto LAB_0014625b;
      iVar3 = iVar3 + -1;
      break;
    case 0x29:
    case 0x2d:
    case 0x2f:
    case 0x31:
    case 0x33:
      pptr = pptr + pptr[1];
    }
    uVar4 = uVar4 >> 0x10 & 0x7fff;
    if (uVar4 < 0x40) {
      pptr = pptr + ""[uVar4];
      bVar1 = false;
      puVar2 = in_RAX;
    }
    else {
switchD_001461c5_caseD_0:
      puVar2 = (uint32_t *)0x0;
    }
LAB_001461f1:
    if (bVar1) {
      return puVar2;
    }
    pptr = pptr + 1;
    in_RAX = puVar2;
  } while( true );
}

Assistant:

static uint32_t *
parsed_skip(uint32_t *pptr, uint32_t skiptype)
{
uint32_t nestlevel = 0;

for (;; pptr++)
  {
  uint32_t meta = META_CODE(*pptr);

  switch(meta)
    {
    default:  /* Just skip over most items */
    if (meta < META_END) continue;  /* Literal */
    break;

    /* This should never occur. */

    case META_END:
    return NULL;

    /* The data for these items is variable in length. */

    case META_BACKREF:  /* Offset is present only if group >= 10 */
    if (META_DATA(*pptr) >= 10) pptr += SIZEOFFSET;
    break;

    case META_ESCAPE:   /* A few escapes are followed by data items. */
    switch (META_DATA(*pptr))
      {
      case ESC_P:
      case ESC_p:
      pptr += 1;
      break;

      case ESC_g:
      case ESC_k:
      pptr += 1 + SIZEOFFSET;
      break;
      }
    break;

    case META_MARK:     /* Add the length of the name. */
    case META_COMMIT_ARG:
    case META_PRUNE_ARG:
    case META_SKIP_ARG:
    case META_THEN_ARG:
    pptr += pptr[1];
    break;

    /* These are the "active" items in this loop. */

    case META_CLASS_END:
    if (skiptype == PSKIP_CLASS) return pptr;
    break;

    case META_ATOMIC:
    case META_CAPTURE:
    case META_COND_ASSERT:
    case META_COND_DEFINE:
    case META_COND_NAME:
    case META_COND_NUMBER:
    case META_COND_RNAME:
    case META_COND_RNUMBER:
    case META_COND_VERSION:
    case META_LOOKAHEAD:
    case META_LOOKAHEADNOT:
    case META_LOOKAHEAD_NA:
    case META_LOOKBEHIND:
    case META_LOOKBEHINDNOT:
    case META_LOOKBEHIND_NA:
    case META_NOCAPTURE:
    case META_SCRIPT_RUN:
    nestlevel++;
    break;

    case META_ALT:
    if (nestlevel == 0 && skiptype == PSKIP_ALT) return pptr;
    break;

    case META_KET:
    if (nestlevel == 0) return pptr;
    nestlevel--;
    break;
    }

  /* The extra data item length for each meta is in a table. */

  meta = (meta >> 16) & 0x7fff;
  if (meta >= sizeof(meta_extra_lengths)) return NULL;
  pptr += meta_extra_lengths[meta];
  }
/* Control never reaches here */
return pptr;
}